

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_trace_file.c
# Opt level: O0

mFILE * open_path_mfile(char *file,char *path,char *relative_to)

{
  int iVar1;
  mFILE *pmVar2;
  mFILE *pmVar3;
  size_t sVar4;
  char local_1058 [8];
  char relative_path [4097];
  char *cp;
  char *ele2;
  mFILE *fp;
  char *ele;
  char *newsearch;
  char *relative_to_local;
  char *path_local;
  char *file_local;
  
  relative_to_local = path;
  if (path == (char *)0x0) {
    relative_to_local = getenv("RAWDATA");
  }
  pmVar2 = (mFILE *)tokenise_search_path(relative_to_local);
  fp = pmVar2;
  if (pmVar2 != (mFILE *)0x0) {
    for (; *(char *)&fp->fp != '\0'; fp = (mFILE *)((long)&fp->fp + sVar4 + 1)) {
      if (*(char *)&fp->fp == '|') {
        cp = (char *)((long)&fp->fp + 1);
      }
      else {
        cp = (char *)fp;
      }
      iVar1 = strncmp(cp,"URL=",4);
      if (iVar1 == 0) {
        pmVar3 = find_file_url(file,cp + 4);
        if (pmVar3 != (mFILE *)0x0) {
          free(pmVar2);
          return pmVar3;
        }
      }
      else {
        iVar1 = strncmp(cp,"http:",5);
        if ((iVar1 == 0) || (iVar1 = strncmp(cp,"ftp:",4), iVar1 == 0)) {
          pmVar3 = find_file_url(file,cp);
          if (pmVar3 != (mFILE *)0x0) {
            free(pmVar2);
            return pmVar3;
          }
        }
        else {
          pmVar3 = find_file_dir(file,cp);
          if (pmVar3 != (mFILE *)0x0) {
            free(pmVar2);
            return pmVar3;
          }
        }
      }
      sVar4 = strlen((char *)fp);
    }
    free(pmVar2);
    if (relative_to != (char *)0x0) {
      strcpy(local_1058,relative_to);
      register0x00000000 = strrchr(local_1058,0x2f);
      if (register0x00000000 != (char *)0x0) {
        *register0x00000000 = '\0';
      }
      pmVar2 = find_file_dir(file,local_1058);
      if (pmVar2 != (mFILE *)0x0) {
        return pmVar2;
      }
    }
  }
  return (mFILE *)0x0;
}

Assistant:

mFILE *open_path_mfile(char *file, char *path, char *relative_to) {
    char *newsearch;
    char *ele;
    mFILE *fp;

    /* Use path first */
    if (!path)
	path = getenv("RAWDATA");
    if (NULL == (newsearch = tokenise_search_path(path)))
	return NULL;
    
    /*
     * Step through the search path testing out each component.
     * We now look through each path element treating some prefixes as
     * special, otherwise we treat the element as a directory.
     */
    for (ele = newsearch; *ele; ele += strlen(ele)+1) {
	char *ele2;

	/*
	 * '|' prefixing a path component indicates that we do not
	 * wish to perform the compression extension searching in that
	 * location.
	 *
	 * NB: this has been removed from the htslib implementation.
	 */
	if (*ele == '|') {
	    ele2 = ele+1;
	} else {
	    ele2 = ele;
	}

	if (0 == strncmp(ele2, "URL=", 4)) {
	    if ((fp = find_file_url(file, ele2+4))) {
		free(newsearch);
		return fp;
	    }
	} else if (!strncmp(ele2, "http:", 5) ||
		   !strncmp(ele2, "ftp:", 4)) {
	    if ((fp = find_file_url(file, ele2))) {
		free(newsearch);
		return fp;
	    }
	} else if ((fp = find_file_dir(file, ele2))) {
	    free(newsearch);
	    return fp;
	} 
   }

    free(newsearch);

    /* Look in the same location as the incoming 'relative_to' filename */
    if (relative_to) {
	char *cp;
	char relative_path[PATH_MAX+1];
	strcpy(relative_path, relative_to);
	if ((cp = strrchr(relative_path, '/')))
	    *cp = 0;
	if ((fp = find_file_dir(file, relative_path)))
	    return fp;
    }

    return NULL;
}